

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O0

void __thiscall UniValue::writeObject(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  size_type sVar1;
  const_reference pvVar2;
  string *in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_FS_OFFSET;
  uint i;
  uint in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  UniValue *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint local_a4;
  UniValue local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  if (in_ESI != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  }
  local_a4 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (sVar1 <= local_a4) break;
    if (in_ESI != 0) {
      indentStr(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,(string *)0x1ab255a);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_88.val.field_2._M_local_buf + 8);
    json_escape(in_RCX);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff28);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (in_ESI != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
    }
    pvVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::at
                       ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff28,
                        (size_type)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff28 = &local_88;
    write_abi_cxx11_(in_stack_ffffffffffffff28,(int)pvVar2,(void *)(ulong)in_ESI,(ulong)(in_EDX + 1)
                    );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_a4;
    sVar1 = std::vector<UniValue,_std::allocator<UniValue>_>::size
                      ((vector<UniValue,_std::allocator<UniValue>_> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (in_stack_ffffffffffffff20 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 - 1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
    }
    if (in_ESI != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
    }
    local_a4 = local_a4 + 1;
  }
  if (in_ESI != 0) {
    indentStr(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,(string *)0x1ab2761);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::writeObject(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "{";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < keys.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += "\"" + json_escape(keys[i]) + "\":";
        if (prettyIndent)
            s += " ";
        s += values.at(i).write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1))
            s += ",";
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "}";
}